

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void tests::disconnect_edge(void)

{
  initializer_list<N_*> ns;
  initializer_list<N_*> ns_00;
  N *this;
  void *pvVar1;
  N *pNVar2;
  ostream *poVar3;
  NS *pNVar4;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> viewed;
  N *n3;
  N *n2;
  N *n1;
  N *r;
  N *q;
  N *p;
  NS *g;
  NS *in_stack_fffffffffffffe48;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *in_stack_fffffffffffffe50;
  vector<N_*,_std::allocator<N_*>_> *this_00;
  char *in_stack_fffffffffffffe58;
  N *in_stack_fffffffffffffea8;
  N *in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  size_type in_stack_fffffffffffffec0;
  vector<N_*,_std::allocator<N_*>_> *in_stack_fffffffffffffef0;
  Alg<void> *in_stack_fffffffffffffef8;
  N *in_stack_ffffffffffffff00;
  void *local_d8;
  sockaddr *local_d0;
  undefined8 local_c8;
  void *local_c0;
  void **local_b8;
  undefined8 local_b0;
  void *local_a8;
  void *local_a0;
  void **local_98;
  undefined8 local_90;
  void *local_88;
  sockaddr *local_80;
  undefined8 local_78;
  void *local_70;
  void *local_68;
  sockaddr *local_60;
  undefined8 local_58;
  void *local_50;
  sockaddr *local_48;
  undefined8 local_40;
  void *local_38;
  void *local_30;
  N *local_28;
  void *local_20;
  void *local_18;
  void *local_10;
  N *local_8;
  
  this = (N *)operator_new(0x18);
  (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NS::NS((NS *)0x1782fc);
  local_8 = this;
  pvVar1 = N::operator_new((size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  N::N<char_const*>(this,in_stack_fffffffffffffe58);
  local_10 = pvVar1;
  pvVar1 = N::operator_new((size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  N::N<char_const*>(this,in_stack_fffffffffffffe58);
  local_18 = pvVar1;
  pvVar1 = N::operator_new((size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  N::N<char_const*>(this,in_stack_fffffffffffffe58);
  local_20 = pvVar1;
  pNVar2 = (N *)N::operator_new((size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  N::N<char_const*>(this,in_stack_fffffffffffffe58);
  local_28 = pNVar2;
  pvVar1 = N::operator_new((size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  N::N<char_const*>(this,in_stack_fffffffffffffe58);
  local_30 = pvVar1;
  pvVar1 = N::operator_new((size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  N::N<char_const*>(this,in_stack_fffffffffffffe58);
  local_50 = local_30;
  local_48 = (sockaddr *)&local_50;
  local_40 = 1;
  local_38 = pvVar1;
  N::connect(local_28,(int)local_10,local_48,1);
  local_70 = local_30;
  local_68 = local_38;
  local_60 = (sockaddr *)&local_70;
  local_58 = 2;
  N::connect(local_28,(int)local_18,local_60,2);
  local_88 = local_38;
  local_80 = (sockaddr *)&local_88;
  local_78 = 1;
  N::connect(local_28,(int)local_20,local_80,1);
  local_a8 = local_30;
  local_a0 = local_38;
  local_98 = &local_a8;
  local_90 = 2;
  ns._M_len = in_stack_fffffffffffffec0;
  ns._M_array = in_stack_fffffffffffffeb8;
  N::disconnect(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,ns);
  local_c0 = local_38;
  local_b8 = &local_c0;
  local_b0 = 1;
  ns_00._M_len = in_stack_fffffffffffffec0;
  ns_00._M_array = in_stack_fffffffffffffeb8;
  N::disconnect(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,ns_00);
  local_d8 = local_38;
  local_d0 = (sockaddr *)&local_d8;
  local_c8 = 1;
  N::connect(local_28,(int)local_18,local_d0,1);
  std::set<N_*,_std::less<N_*>,_std::allocator<N_*>_>::set
            ((set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)0x178653);
  poVar3 = std::operator<<((ostream *)&std::cout,"digraph T {");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  alg::dot((ostream *)local_28,in_stack_fffffffffffffe50);
  this_00 = (vector<N_*,_std::allocator<N_*>_> *)&stack0xfffffffffffffea8;
  std::vector<N_*,_std::allocator<N_*>_>::vector((vector<N_*,_std::allocator<N_*>_> *)0x1786ce);
  N::histo(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::vector<N_*,_std::allocator<N_*>_>::~vector(this_00);
  std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::~function
            ((function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)0x1786fe);
  poVar3 = std::operator<<((ostream *)&std::cout,"}");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pNVar4 = NS::clear((NS *)this);
  if (pNVar4 != (NS *)0x0) {
    NS::~NS((NS *)0x178754);
    operator_delete(pNVar4,0x18);
  }
  std::set<N_*,_std::less<N_*>,_std::allocator<N_*>_>::~set
            ((set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)0x178770);
  return;
}

Assistant:

void disconnect_edge() {
        auto g = new NS();
        auto p = new(g) N("p"), q = new(g) N("q"), r = new(g) N("r");
        auto n1 = new(g) N("x"), n2 = new(g) N("y"), n3 = new(g) N("z");

        n1->connect(p, {n2});
        n1->connect(q, {n2, n3});
        n1->connect(r, {n3});

        n1->disconnect(q, {n2, n3});
        n1->disconnect(r, {n3});
        n1->connect(q, {n3});

        std::set<N*> viewed;
        cout << "digraph T {" << endl;
        n1->histo(alg::dot(cout, viewed));
        cout << "}" << endl;

        delete g->clear();
    }